

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

void __thiscall pybind11::function::function(function *this,object *o)

{
  bool bVar1;
  undefined1 auVar2 [16];
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  handle local_20;
  object *local_18;
  object *o_local;
  function *this_local;
  
  local_18 = o;
  o_local = &this->super_object;
  object::object(&this->super_object,o);
  if ((this->super_object).super_handle.m_ptr != (PyObject *)0x0) {
    pybind11::handle::handle(&local_20,(this->super_object).super_handle.m_ptr);
    bVar1 = check_(local_20);
    if (!bVar1) {
      auVar2 = __cxa_allocate_exception(0x10);
      pybind11::detail::get_fully_qualified_tp_name_abi_cxx11_
                (&local_90,(detail *)((this->super_object).super_handle.m_ptr)->ob_type,auVar2._8_8_
                );
      std::operator+(&local_70,"Object of type \'",&local_90);
      std::operator+(&local_50,&local_70,"\' is not an instance of \'function\'");
      type_error::runtime_error(auVar2._0_8_,&local_50);
      __cxa_throw(auVar2._0_8_,&type_error::typeinfo,type_error::~type_error);
    }
  }
  return;
}

Assistant:

handle cpp_function() const {
        handle fun = detail::get_function(m_ptr);
        if (fun && PyCFunction_Check(fun.ptr()))
            return fun;
        return handle();
    }